

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_vhost.c
# Opt level: O1

int mk_vhost_map_handlers(mk_server *server)

{
  mk_plugin *pmVar1;
  mk_list *pmVar2;
  int iVar3;
  char *format;
  mk_list *pmVar4;
  mk_list *pmVar5;
  
  pmVar4 = (server->hosts).next;
  if (pmVar4 == &server->hosts) {
    iVar3 = 0;
  }
  else {
    iVar3 = 0;
    do {
      for (pmVar5 = pmVar4[-1].next; pmVar5 != pmVar4 + -1; pmVar5 = pmVar5->next) {
        pmVar1 = mk_plugin_lookup((char *)pmVar5[-4].next,server);
        if (pmVar1 == (mk_plugin *)0x0) {
          pmVar2 = pmVar5[-4].next;
          format = "Plugin \'%s\' was not loaded";
LAB_0010836e:
          mk_print(0x1001,format,pmVar2);
        }
        else {
          if (pmVar1->hooks != 0x100) {
            pmVar2 = pmVar5[-4].next;
            format = "Plugin \'%s\' is not a handler";
            goto LAB_0010836e;
          }
          pmVar5[-1].next = (mk_list *)pmVar1;
          iVar3 = iVar3 + 1;
        }
      }
      pmVar4 = pmVar4->next;
    } while (pmVar4 != &server->hosts);
  }
  return iVar3;
}

Assistant:

int mk_vhost_map_handlers(struct mk_server *server)
{
    int n = 0;
    struct mk_list *head;
    struct mk_list *head_handler;
    struct mk_vhost *host;
    struct mk_vhost_handler *h_handler;
    struct mk_plugin *p;

    mk_list_foreach(head, &server->hosts) {
        host = mk_list_entry(head, struct mk_vhost, _head);
        mk_list_foreach(head_handler, &host->handlers) {
            h_handler = mk_list_entry(head_handler,
                                      struct mk_vhost_handler, _head);

            /* Lookup plugin by name */
            p = mk_plugin_lookup(h_handler->name, server);
            if (!p) {
                mk_err("Plugin '%s' was not loaded", h_handler->name);
                continue;
            }

            if (p->hooks != MK_PLUGIN_STAGE) {
                mk_err("Plugin '%s' is not a handler", h_handler->name);
                continue;
            }

            h_handler->handler = p;
            n++;
        }
    }

    return n;
}